

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall
QTableViewPrivate::drawCell
          (QTableViewPrivate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  QWidget *this_00;
  Data *pDVar1;
  QAbstractItemModel *pQVar2;
  char cVar3;
  ulong uVar4;
  QStyle *pQVar5;
  long *plVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QStyleOptionViewItem opt;
  QModelIndex local_120;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108,option);
  pDVar1 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->super_QAbstractItemViewPrivate).selectionModel.wp.value != (QObject *)0x0)) {
    cVar3 = QItemSelectionModel::isSelected
                      ((QModelIndex *)(this->super_QAbstractItemViewPrivate).selectionModel.wp.value
                      );
    if (cVar3 != '\0') {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
           local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x80;
    }
  }
  cVar3 = comparesEqual(&(this->super_QAbstractItemViewPrivate).hover,index);
  if (cVar3 != '\0') {
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x20;
  }
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 1) != 0) {
    pQVar2 = (this->super_QAbstractItemViewPrivate).model;
    uVar4 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,index);
    bVar7 = (uVar4 & 0x20) == 0;
    if (bVar7) {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i._0_1_ =
           (byte)local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                 super_QFlagsStorage<QStyle::StateFlag>.i & 0xfe;
    }
    local_108.super_QStyleOption.palette.currentGroup = (ColorGroup)bVar7;
  }
  QAbstractItemView::currentIndex(&local_120,(QAbstractItemView *)this_00);
  if (((index->r == local_120.r) && (index->c == local_120.c)) &&
     ((index->i == local_120.i && ((index->m).ptr == local_120.m.ptr)))) {
    bVar7 = QWidget::hasFocus(this_00);
    if (!bVar7) {
      bVar7 = QWidget::hasFocus((this->super_QAbstractItemViewPrivate).
                                super_QAbstractScrollAreaPrivate.viewport);
      if (!bVar7) goto LAB_00590920;
    }
    QAbstractItemView::currentIndex(&local_120,(QAbstractItemView *)this_00);
    if (((-1 < local_120.r) && (-1 < local_120.c)) && (local_120.m.ptr != (QAbstractItemModel *)0x0)
       ) {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
           local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 1;
    }
  }
LAB_00590920:
  pQVar5 = QWidget::style(this_00);
  (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,0x2d,&local_108,painter,this_00);
  plVar6 = (long *)(**(code **)(*(long *)this_00 + 0x208))(this_00,index);
  (**(code **)(*plVar6 + 0x60))(plVar6,painter,&local_108,index);
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::drawCell(QPainter *painter, const QStyleOptionViewItem &option, const QModelIndex &index)
{
    Q_Q(QTableView);
    QStyleOptionViewItem opt = option;

    if (selectionModel && selectionModel->isSelected(index))
        opt.state |= QStyle::State_Selected;
    if (index == hover)
        opt.state |= QStyle::State_MouseOver;
    if (option.state & QStyle::State_Enabled) {
        QPalette::ColorGroup cg;
        if ((model->flags(index) & Qt::ItemIsEnabled) == 0) {
            opt.state &= ~QStyle::State_Enabled;
            cg = QPalette::Disabled;
        } else {
            cg = QPalette::Normal;
        }
        opt.palette.setCurrentColorGroup(cg);
    }

    if (index == q->currentIndex()) {
        const bool focus = (q->hasFocus() || viewport->hasFocus()) && q->currentIndex().isValid();
        if (focus)
            opt.state |= QStyle::State_HasFocus;
    }

    q->style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, q);

    q->itemDelegateForIndex(index)->paint(painter, opt, index);
}